

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

DWORD FILEGetLastErrorFromErrno(void)

{
  int *piVar1;
  DWORD local_c;
  DWORD dwRet;
  
  piVar1 = __errno_location();
  switch(*piVar1) {
  case 0:
    local_c = 0;
    break;
  case 1:
  case 0xd:
  case 0x15:
  case 0x1e:
    local_c = 5;
    break;
  case 2:
    local_c = 2;
    break;
  default:
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    piVar1 = __errno_location();
    strerror(*piVar1);
    local_c = 0x1f;
    break;
  case 5:
    local_c = 0x1d;
    break;
  case 9:
    local_c = 6;
    break;
  case 0xc:
    local_c = 8;
    break;
  case 0x10:
    local_c = 0xaa;
    break;
  case 0x11:
    local_c = 0xb7;
    break;
  case 0x14:
    local_c = 3;
    break;
  case 0x1c:
  case 0x7a:
    local_c = 0x70;
    break;
  case 0x22:
    local_c = 0xa1;
    break;
  case 0x24:
    local_c = 0xce;
    break;
  case 0x27:
    local_c = 0x91;
    break;
  case 0x28:
    local_c = 0xa1;
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  piVar1 = __errno_location();
  strerror(*piVar1);
  return local_c;
}

Assistant:

DWORD FILEGetLastErrorFromErrno( void )
{
    DWORD dwRet;

    switch(errno)
    {
    case 0:
        dwRet = ERROR_SUCCESS; 
        break;
    case ENAMETOOLONG:
        dwRet = ERROR_FILENAME_EXCED_RANGE;
        break;
    case ENOTDIR:
        dwRet = ERROR_PATH_NOT_FOUND; 
        break;
    case ENOENT:
        dwRet = ERROR_FILE_NOT_FOUND; 
        break;
    case EACCES:
    case EPERM:
    case EROFS:
    case EISDIR:
        dwRet = ERROR_ACCESS_DENIED; 
        break;
    case EEXIST:
        dwRet = ERROR_ALREADY_EXISTS; 
        break;
#if !defined(_AIX)
    // ENOTEMPTY is the same as EEXIST on AIX. Meaningful when involving directory operations
    case ENOTEMPTY:
        dwRet = ERROR_DIR_NOT_EMPTY; 
        break;
#endif
    case EBADF:
        dwRet = ERROR_INVALID_HANDLE; 
        break;
    case ENOMEM:
        dwRet = ERROR_NOT_ENOUGH_MEMORY; 
        break;
    case EBUSY:
        dwRet = ERROR_BUSY;
        break;
    case ENOSPC:
    case EDQUOT:
        dwRet = ERROR_DISK_FULL;
        break;
    case ELOOP:
        dwRet = ERROR_BAD_PATHNAME;
        break;
    case EIO:
        dwRet = ERROR_WRITE_FAULT;
        break;
    case ERANGE:
        dwRet = ERROR_BAD_PATHNAME;
        break;
    default:
        ERROR("unexpected errno %d (%s); returning ERROR_GEN_FAILURE\n",
              errno, strerror(errno));
        dwRet = ERROR_GEN_FAILURE;
    }

    TRACE("errno = %d (%s), LastError = %d\n", errno, strerror(errno), dwRet);

    return dwRet;
}